

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O0

void __thiscall EndSymbol::restoreXml(EndSymbol *this,Element *el,SleighBase *trans)

{
  AddrSpace *pAVar1;
  PatternExpression *this_00;
  SleighBase *trans_local;
  Element *el_local;
  EndSymbol *this_local;
  
  pAVar1 = AddrSpaceManager::getConstantSpace((AddrSpaceManager *)trans);
  this->const_space = pAVar1;
  this_00 = (PatternExpression *)operator_new(0x10);
  EndInstructionValue::EndInstructionValue((EndInstructionValue *)this_00);
  this->patexp = this_00;
  PatternExpression::layClaim(this->patexp);
  return;
}

Assistant:

void EndSymbol::restoreXml(const Element *el,SleighBase *trans)

{
  const_space = trans->getConstantSpace();
  patexp = new EndInstructionValue();
  patexp->layClaim();
}